

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thief.c
# Opt level: O1

void do_search(CHAR_DATA *ch,char *argument)

{
  short sVar1;
  short sVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  CClass *this;
  OBJ_DATA *obj;
  OBJ_AFFECT_DATA *pOVar6;
  
  act("You intently scrutinize your surroundings...",ch,(void *)0x0,(void *)0x0,3);
  act("$n intently scrutinizes $s surroundings...",ch,(void *)0x0,(void *)0x0,0);
  iVar4 = number_percent();
  for (obj = ch->in_room->contents; obj != (OBJ_DATA *)0x0; obj = obj->next_content) {
    bVar3 = is_affected_obj(obj,(int)gsn_stash);
    if (bVar3) {
      for (pOVar6 = obj->affected; (pOVar6 != (OBJ_AFFECT_DATA *)0x0 && (pOVar6->type != gsn_stash))
          ; pOVar6 = pOVar6->next) {
        sVar1 = ch->level;
        sVar2 = pOVar6->level;
        this = ch->my_class;
        if ((this == (CClass *)0x0) &&
           ((ch->pIndexData == (MOB_INDEX_DATA *)0x0 ||
            (this = ch->pIndexData->my_class, this == (CClass *)0x0)))) {
          this = CClass::GetClass(0);
        }
        iVar4 = iVar4 + ((int)sVar1 - (int)sVar2);
        iVar5 = CClass::GetIndex(this);
        if (iVar5 == 2) {
          iVar4 = iVar4 + ((int)(short)(ch->level - (ch->level >> 0xf)) >> 1);
        }
        if (pOVar6->owner != ch) {
          iVar5 = number_percent();
          if (iVar5 < iVar4) {
            affect_strip_obj(obj,(int)gsn_stash);
            act("You stumble across $p which seemed to be hidden from your eye.",ch,obj,(void *)0x0,
                3);
            act("$n stumbles across and reveals $p.",ch,obj,(void *)0x0,0);
          }
        }
      }
    }
  }
  WAIT_STATE(ch,0x18);
  return;
}

Assistant:

void do_search(CHAR_DATA *ch, char *argument)
{
	OBJ_DATA *obj = nullptr;
	OBJ_AFFECT_DATA *oaf;
	int chance;

	act("You intently scrutinize your surroundings...", ch, 0, 0, TO_CHAR);
	act("$n intently scrutinizes $s surroundings...", ch, 0, 0, TO_ROOM);

	chance = number_percent();

	for (obj = ch->in_room->contents; obj != nullptr; obj = obj->next_content)
	{
		if (is_affected_obj(obj, gsn_stash))
		{
			for (oaf = obj->affected; oaf != nullptr; oaf = oaf->next)
			{
				if (oaf->type == gsn_stash)
					break;

				chance += (ch->level - oaf->level);

				if (ch->Class()->GetIndex() == CLASS_THIEF)
					chance += (ch->level / 2);

				if (oaf->owner != ch && (number_percent() < chance))
				{
					affect_strip_obj(obj, gsn_stash);
					act("You stumble across $p which seemed to be hidden from your eye.", ch, obj, 0, TO_CHAR);
					act("$n stumbles across and reveals $p.", ch, obj, 0, TO_ROOM);
				}
			}
		}
	}

	WAIT_STATE(ch, PULSE_VIOLENCE * 2);
}